

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

TheoryElement * __thiscall
Potassco::TheoryData::addElement(TheoryData *this,Id_t id,IdSpan *terms,Id_t cId)

{
  bool bVar1;
  TheoryElement *pTVar2;
  uint32_t i;
  ulong uVar3;
  TheoryElement *local_38;
  
  uVar3 = (this->data_->elems).top >> 3;
  if ((id < (uint)uVar3) &&
     (pTVar2 = *(TheoryElement **)((long)(this->data_->elems).mem.beg_ + (ulong)id * 8),
     pTVar2 != (TheoryElement *)0x0)) {
    bVar1 = isNewElement(this,id);
    if (bVar1) {
      fail(-2,"const TheoryElement &Potassco::TheoryData::addElement(Id_t, const IdSpan &, Id_t)",
           0xea,"!isNewElement(id)","Redefinition of theory element \'%u\'",(ulong)id,0);
    }
    TheoryElement::destroy(pTVar2);
  }
  else {
    for (; (uint)uVar3 <= id; uVar3 = (ulong)((uint)uVar3 + 1)) {
      local_38 = (TheoryElement *)0x0;
      Data::RawStack<Potassco::TheoryElement_*>::push(&this->data_->elems,&local_38);
    }
  }
  pTVar2 = TheoryElement::newElement(terms,cId);
  *(TheoryElement **)((long)(this->data_->elems).mem.beg_ + (ulong)id * 8) = pTVar2;
  return pTVar2;
}

Assistant:

const TheoryElement& TheoryData::addElement(Id_t id, const IdSpan& terms, Id_t cId) {
	if (!hasElement(id)) {
		for (uint32_t i = numElems(); i <= id; ++i) { data_->elems.push(); }
	}
	else {
		POTASSCO_REQUIRE(!isNewElement(id), "Redefinition of theory element '%u'", id);
		DestroyT()(elems()[id]);
	}
	return *(elems()[id] = TheoryElement::newElement(terms, cId));
}